

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::copy_and_expand_chars<std::back_insert_iterator<std::__cxx11::string>,char>
           (char *begin,char *end,char noexpand,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  char cVar2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_38.container = in_RAX;
  do {
    if (begin == end) {
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )out.container;
    }
    cVar1 = *begin;
    if (cVar1 == noexpand) {
LAB_0011c054:
      local_38.container = out.container;
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_38,begin);
    }
    else {
      cVar2 = (char)out.container;
      if (cVar1 == '\"') {
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
LAB_0011c12d:
        std::__cxx11::string::push_back(cVar2);
      }
      else if (cVar1 == '&') {
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
      else {
        if (cVar1 != '\'') {
          if (cVar1 == '>') {
            std::__cxx11::string::push_back(cVar2);
          }
          else {
            if (cVar1 != '<') goto LAB_0011c054;
            std::__cxx11::string::push_back(cVar2);
          }
          goto LAB_0011c12d;
        }
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
      std::__cxx11::string::push_back(cVar2);
      std::__cxx11::string::push_back(cVar2);
    }
    begin = begin + 1;
  } while( true );
}

Assistant:

inline OutIt copy_and_expand_chars(const Ch *begin, const Ch *end, Ch noexpand, OutIt out)
        {
            while (begin != end)
            {
                if (*begin == noexpand)
                {
                    *out++ = *begin;    // No expansion, copy character
                }
                else
                {
                    switch (*begin)
                    {
                    case Ch('<'):
                        *out++ = Ch('&'); *out++ = Ch('l'); *out++ = Ch('t'); *out++ = Ch(';');
                        break;
                    case Ch('>'): 
                        *out++ = Ch('&'); *out++ = Ch('g'); *out++ = Ch('t'); *out++ = Ch(';');
                        break;
                    case Ch('\''): 
                        *out++ = Ch('&'); *out++ = Ch('a'); *out++ = Ch('p'); *out++ = Ch('o'); *out++ = Ch('s'); *out++ = Ch(';');
                        break;
                    case Ch('"'): 
                        *out++ = Ch('&'); *out++ = Ch('q'); *out++ = Ch('u'); *out++ = Ch('o'); *out++ = Ch('t'); *out++ = Ch(';');
                        break;
                    case Ch('&'): 
                        *out++ = Ch('&'); *out++ = Ch('a'); *out++ = Ch('m'); *out++ = Ch('p'); *out++ = Ch(';'); 
                        break;
                    default:
                        *out++ = *begin;    // No expansion, copy character
                    }
                }
                ++begin;    // Step to next character
            }
            return out;
        }